

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdJmpnz(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Command xVar1;
  x86Instruction *pxVar2;
  x86Instruction *pxVar3;
  bool bVar4;
  x86Instruction *local_40;
  x86Instruction *xorInst;
  x86Instruction *cmpInst;
  x86Instruction *pxStack_28;
  x86Command setCmd;
  x86Instruction *setInst;
  x86Reg sourceReg;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx_local._3_1_ = cmd.rC;
  setInst._4_4_ =
       CodeGenGenericContext::FindRegAtMemory
                 (&ctx->ctx,sDWORD,rNONE,1,rEBX,(uint)ctx_local._3_1_ << 3,true);
  ctx_local._4_4_ = cmd.argument;
  if (setInst._4_4_ == rRegCount) {
    setInst._4_4_ = rEAX;
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  }
  else {
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    if (((ctx->ctx).x86LookBehind & 1U) != 0) {
      pxStack_28 = (ctx->ctx).x86Op;
      while( true ) {
        bVar4 = true;
        if (pxStack_28->name != o_none) {
          bVar4 = pxStack_28->name == o_other;
        }
        if (!bVar4) break;
        pxStack_28 = pxStack_28 + -1;
      }
      if ((((0x2b < (int)pxStack_28->name) && ((int)pxStack_28->name < 0x34)) &&
          ((pxStack_28->argA).type == argReg)) && ((pxStack_28->argA).field_1.reg == setInst._4_4_))
      {
        xVar1 = pxStack_28->name;
        pxVar3 = pxStack_28;
        do {
          pxVar2 = pxVar3;
          xorInst = pxVar2 + -1;
          bVar4 = true;
          if (xorInst->name != o_none) {
            bVar4 = xorInst->name == o_other;
          }
          pxVar3 = xorInst;
        } while (bVar4);
        if (xorInst->name == o_cmp) {
          local_40 = pxVar2 + -2;
          while( true ) {
            bVar4 = true;
            if (local_40->name != o_none) {
              bVar4 = local_40->name == o_other;
            }
            if (!bVar4) break;
            local_40 = local_40 + -1;
          }
          if (((local_40->name == o_xor) && ((local_40->argA).type == argReg)) &&
             (((local_40->argA).field_1.reg == setInst._4_4_ &&
              (((local_40->argB).type == argReg && ((local_40->argB).field_1.reg == setInst._4_4_)))
              ))) {
            if (((pxVar2[-1].argA.type != argReg) || (pxVar2[-1].argA.field_1.reg != setInst._4_4_))
               && ((pxVar2[-1].argB.type != argReg || (pxVar2[-1].argB.field_1.reg != setInst._4_4_)
                   ))) {
              local_40->name = o_none;
            }
            pxStack_28->name = o_none;
            (ctx->ctx).optimizationCount = (ctx->ctx).optimizationCount + 1;
            EMIT_OP_LABEL(&ctx->ctx,GenCodeCmdJmpnz::jump[(int)(xVar1 - o_setl)],
                          ctx_local._4_4_ | 0xc0000000,1,1);
            return;
          }
        }
      }
    }
  }
  EMIT_OP_REG_REG(&ctx->ctx,o_test,setInst._4_4_,setInst._4_4_);
  EMIT_OP_LABEL(&ctx->ctx,o_jne,ctx_local._4_4_ | 0xc0000000,1,1);
  return;
}

Assistant:

void GenCodeCmdJmpnz(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{

	x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, cmd.rC * 8, true);

	if(sourceReg == rRegCount)
	{
		sourceReg = rEAX;

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, sourceReg, sDWORD, rREG, cmd.rC * 8); // Load value

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
		ctx.ctx.KillLateUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
	}
	else
	{
		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
		ctx.ctx.KillLateUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		if(ctx.ctx.x86LookBehind)
		{
			// Transform "xor, cmp, setcc, test, jz/jnz" into "cmp, jmpcc"
			x86Instruction *setInst = ctx.ctx.x86Op;

			while(setInst->name == o_none || setInst->name == o_other)
				setInst--;

			if((setInst->name >= o_setl && setInst->name <= o_setnz) && setInst->argA.type == x86Argument::argReg && setInst->argA.reg == sourceReg)
			{
				x86Command setCmd = setInst->name;

				x86Instruction *cmpInst = setInst - 1;

				while(cmpInst->name == o_none || cmpInst->name == o_other)
					cmpInst--;

				if(cmpInst->name == o_cmp)
				{
					x86Instruction *xorInst = cmpInst - 1;

					while(xorInst->name == o_none || xorInst->name == o_other)
						xorInst--;

					if(xorInst->name == o_xor && xorInst->argA.type == x86Argument::argReg && xorInst->argA.reg == sourceReg && xorInst->argB.type == x86Argument::argReg && xorInst->argB.reg == sourceReg)
					{
						// Keep xor if it's used by compare
						if(!((cmpInst->argA.type == x86Argument::argReg && cmpInst->argA.reg == sourceReg) || (cmpInst->argB.type == x86Argument::argReg && cmpInst->argB.reg == sourceReg)))
							xorInst->name = o_none;

						setInst->name = o_none;

						static const x86Command jump[] = { o_jl, o_jg, o_jle, o_jge, o_je, o_jne, o_jz, o_jnz };

						ctx.ctx.optimizationCount++;

						EMIT_OP_LABEL(ctx.ctx, jump[setCmd - o_setl], LABEL_GLOBAL | JUMP_NEAR | cmd.argument, true, true);
						return;
					}
				}
			}
		}
	}

	EMIT_OP_REG_REG(ctx.ctx, o_test, sourceReg, sourceReg);
	EMIT_OP_LABEL(ctx.ctx, o_jnz, LABEL_GLOBAL | JUMP_NEAR | cmd.argument, true, true);
}